

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessSamplersTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Samplers::DefaultsTest::testSamplerIntegerParameter
          (DefaultsTest *this,GLenum pname,GLint expected_value)

{
  ostringstream *poVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  char *pcVar3;
  GLint value;
  int local_1ac;
  undefined1 local_1a8 [384];
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1ac = -1;
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0xa50))(this->m_sampler_dsa,pname,&local_1ac);
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"glGetSamplerParameteriv have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessSamplersTests.cpp"
                  ,0x107);
  if (local_1ac == -1) {
    local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"glGetSamplerParameteriv with parameter ");
    pcVar3 = glu::getTextureParameterName(pname);
    std::operator<<((ostream *)poVar1,pcVar3);
    std::operator<<((ostream *)poVar1," has not returned anything and error has not been generated."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if (local_1ac == expected_value) {
      return true;
    }
    local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"glGetSamplerParameteriv with parameter ");
    pcVar3 = glu::getTextureParameterName(pname);
    std::operator<<((ostream *)poVar1,pcVar3);
    std::operator<<((ostream *)poVar1," has returned ");
    std::ostream::operator<<(poVar1,local_1ac);
    std::operator<<((ostream *)poVar1,", however ");
    std::ostream::operator<<(poVar1,expected_value);
    std::operator<<((ostream *)poVar1," was expected.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a8 + 8));
  return false;
}

Assistant:

bool DefaultsTest::testSamplerIntegerParameter(glw::GLenum pname, glw::GLint expected_value)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get data. */
	glw::GLint value = -1;

	gl.getSamplerParameteriv(m_sampler_dsa, pname, &value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetSamplerParameteriv have failed");

	if (-1 == value)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "glGetSamplerParameteriv with parameter " << glu::getTextureParameterName(pname)
			<< " has not returned anything and error has not been generated." << tcu::TestLog::EndMessage;

		return false;
	}
	else
	{
		if (expected_value != value)
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "glGetSamplerParameteriv with parameter "
												<< glu::getTextureParameterName(pname) << " has returned " << value
												<< ", however " << expected_value << " was expected."
												<< tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}